

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_std_urlGet(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint8_t *puVar1;
  byte c;
  int64_t iVar2;
  int iVar3;
  uint uVar4;
  char *__s;
  JSRuntime *pJVar5;
  size_t sVar6;
  FILE *__stream;
  uint8_t *data;
  undefined4 extraout_var;
  size_t len;
  ulong uVar7;
  JSValueUnion JVar8;
  size_t sVar9;
  char *p;
  uint8_t *puVar10;
  JSValue v;
  JSValue JVar11;
  JSValue JVar12;
  JSValue JVar13;
  JSValue val;
  BOOL full_flag;
  BOOL binary_flag;
  DynBuf header_buf_s;
  DynBuf data_buf_s;
  DynBuf cmd_buf;
  BOOL local_e8;
  BOOL local_e4;
  int64_t local_e0;
  undefined8 local_d8;
  DynBuf *local_d0;
  JSValueUnion local_c8;
  DynBuf local_c0;
  DynBuf local_90;
  DynBuf local_60;
  
  uVar7 = (ulong)(uint)argc;
  __s = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  if (__s != (char *)0x0) {
    local_e4 = 0;
    local_e8 = 0;
    if (1 < argc) {
      JVar12 = argv[1];
      iVar3 = get_bool_option(ctx,&local_e4,argv[1],"binary");
      if ((iVar3 != 0) || (iVar3 = get_bool_option(ctx,&local_e8,JVar12,"full"), iVar3 != 0)) {
        JS_FreeCString(ctx,__s);
        goto LAB_00111bbf;
      }
    }
    pJVar5 = JS_GetRuntime(ctx);
    dbuf_init2(&local_60,pJVar5,js_realloc_rt);
    dbuf_printf(&local_60,"%s \'\'","curl -s -i");
    sVar6 = strlen(__s);
    if (sVar6 != 0) {
      sVar9 = 0;
      do {
        c = __s[sVar9];
        uVar7 = (ulong)c;
        if ((c == 0x5c) || (c == 0x27)) {
          dbuf_putc(&local_60,'\\');
        }
        dbuf_putc(&local_60,c);
        sVar9 = sVar9 + 1;
      } while (sVar6 != sVar9);
    }
    JS_FreeCString(ctx,__s);
    dbuf_putstr(&local_60,"\'\'");
    dbuf_putc(&local_60,'\0');
    if (local_60.error != 0) {
      dbuf_free(&local_60);
      uVar7 = 0;
      JVar12 = (JSValue)(ZEXT816(6) << 0x40);
      goto LAB_00111c96;
    }
    __stream = popen((char *)local_60.buf,"r");
    dbuf_free(&local_60);
    if (__stream == (FILE *)0x0) {
      JVar12 = JS_ThrowTypeError(ctx,"could not start curl");
      uVar7 = (ulong)JVar12.u.ptr & 0xffffffff00000000;
      goto LAB_00111c96;
    }
    pJVar5 = JS_GetRuntime(ctx);
    local_d0 = &local_90;
    dbuf_init2(local_d0,pJVar5,js_realloc_rt);
    pJVar5 = JS_GetRuntime(ctx);
    dbuf_init2(&local_c0,pJVar5,js_realloc_rt);
    data = (uint8_t *)js_malloc(ctx,0x1000);
    puVar10 = data;
    if (data != (uint8_t *)0x0) {
      do {
        iVar3 = fgetc(__stream);
        if (iVar3 < 0) {
          JVar13 = (JSValue)(ZEXT816(2) << 0x40);
          local_d8 = 0;
          goto LAB_00111dfc;
        }
        if ((ulong)((long)puVar10 - (long)data) < 0xfff) {
          *puVar10 = (uint8_t)iVar3;
          puVar10 = puVar10 + 1;
        }
      } while (iVar3 != 10);
      *puVar10 = '\0';
      for (puVar10 = data + -1; puVar10[1] != '\0'; puVar10 = puVar10 + 1) {
        if (puVar10[1] == ' ') goto LAB_00111d7d;
      }
      local_d8 = 0;
      goto LAB_00111dd7;
    }
    JVar13 = (JSValue)(ZEXT816(3) << 0x40);
    uVar7 = 0;
    data = (uint8_t *)0x0;
    goto LAB_00111e52;
  }
  goto LAB_00111bbf;
LAB_00111d7d:
  do {
    puVar1 = puVar10 + 1;
    puVar10 = puVar10 + 1;
  } while (*puVar1 == ' ');
  iVar3 = atoi((char *)puVar10);
  local_d8 = CONCAT44(extraout_var,iVar3);
LAB_00111dd7:
  puVar10 = data;
  if ((local_e8 == 0) && (99 < (int)local_d8 - 200U)) {
LAB_00111df6:
    JVar13 = (JSValue)(ZEXT816(2) << 0x40);
LAB_00111dfc:
    local_e0 = JVar13.tag;
    JVar8 = JVar13.u;
    js_free(ctx,data);
    pclose(__stream);
    dbuf_free(&local_90);
    if (local_e8 == 0) {
      JVar12.tag = local_e0;
      JVar12.u.ptr = (void *)((ulong)JVar8.ptr & 0xffffffff | uVar7 << 0x20);
    }
    else {
      JVar12 = JS_NewObject(ctx);
      iVar2 = local_e0;
      if ((int)JVar12.tag == 6) {
        __stream = (FILE *)0x0;
        data = (uint8_t *)0x0;
        local_d0 = (DynBuf *)0x0;
        JVar13.tag = local_e0;
        JVar13.u.ptr = JVar8.ptr;
        goto LAB_00111e52;
      }
      val.u.ptr = (void *)((ulong)JVar8.ptr & 0xffffffff | uVar7 << 0x20);
      val.tag = local_e0;
      JS_DefinePropertyValueStr(ctx,JVar12,"response",val,7);
      if ((int)iVar2 != 2) {
        JVar13 = JS_NewStringLen(ctx,(char *)local_c0.buf,local_c0.size);
        JS_DefinePropertyValueStr(ctx,JVar12,"responseHeaders",JVar13,7);
        JS_DefinePropertyValueStr(ctx,JVar12,"status",(JSValue)ZEXT416((uint)local_d8),7);
      }
    }
    dbuf_free(&local_c0);
    uVar7 = (ulong)JVar12.u.ptr & 0xffffffff00000000;
    goto LAB_00111c96;
  }
  do {
    do {
      uVar4 = fgetc(__stream);
      if ((int)uVar4 < 0) goto LAB_00111df6;
      uVar7 = (ulong)uVar4;
      if ((ulong)((long)puVar10 - (long)data) < 0xfff) {
        *puVar10 = (uint8_t)uVar4;
        puVar10 = puVar10 + 1;
      }
      dbuf_putc(&local_c0,(uint8_t)uVar4);
    } while (uVar4 != 10);
    *puVar10 = '\0';
    iVar3 = strcmp((char *)data,"\r\n");
    puVar10 = data;
  } while (iVar3 != 0);
  if (local_c0.error == 0) {
    local_c0.size = local_c0.size - 2;
    len = fread(data,1,0x1000,__stream);
    JVar13 = (JSValue)(ZEXT816(3) << 0x40);
    if (len != 0) {
      do {
        dbuf_put(&local_90,data,len);
        len = fread(data,1,0x1000,__stream);
      } while (len != 0);
    }
    if (local_90.error == 0) {
      if (local_e4 == 0) {
        JVar13 = JS_NewStringLen(ctx,(char *)local_90.buf,local_90.size);
      }
      else {
        JVar13 = JS_NewArrayBufferCopy(ctx,local_90.buf,local_90.size);
      }
      uVar7 = (ulong)JVar13.u.ptr >> 0x20;
      if ((int)JVar13.tag != 6) goto LAB_00111dfc;
    }
    else {
      uVar7 = 0;
    }
  }
  else {
    uVar7 = 0;
    JVar13 = (JSValue)(ZEXT816(3) << 0x40);
  }
LAB_00111e52:
  if (__stream != (FILE *)0x0) {
    pclose(__stream);
  }
  js_free(ctx,data);
  if (local_d0 != (DynBuf *)0x0) {
    dbuf_free(local_d0);
  }
  dbuf_free(&local_c0);
  local_c8.ptr = (void *)((ulong)JVar13.u.ptr & 0xffffffff | uVar7 << 0x20);
  if ((0xfffffff4 < (uint)JVar13.tag) &&
     (iVar3 = *local_c8.ptr, *(int *)local_c8.ptr = iVar3 + -1, iVar3 < 2)) {
    v.tag = JVar13.tag;
    v.u.ptr = local_c8.ptr;
    __JS_FreeValue(ctx,v);
  }
LAB_00111bbf:
  JVar12 = (JSValue)(ZEXT816(6) << 0x40);
  uVar7 = 0;
LAB_00111c96:
  JVar11.u.ptr = (void *)((ulong)JVar12.u.ptr & 0xffffffff | uVar7);
  JVar11.tag = JVar12.tag;
  return JVar11;
}

Assistant:

static JSValue js_std_urlGet(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    const char *url;
    DynBuf cmd_buf;
    DynBuf data_buf_s, *data_buf = &data_buf_s;
    DynBuf header_buf_s, *header_buf = &header_buf_s;
    char *buf; 
    size_t i, len;
    int c, status;
    JSValue response = JS_UNDEFINED, ret_obj;
    JSValueConst options_obj;
    FILE *f;
    BOOL binary_flag, full_flag;
    
    url = JS_ToCString(ctx, argv[0]);
    if (!url)
        return JS_EXCEPTION;
    
    binary_flag = FALSE;
    full_flag = FALSE;
    
    if (argc >= 2) {
        options_obj = argv[1];

        if (get_bool_option(ctx, &binary_flag, options_obj, "binary"))
            goto fail_obj;

        if (get_bool_option(ctx, &full_flag, options_obj, "full")) {
        fail_obj:
            JS_FreeCString(ctx, url);
            return JS_EXCEPTION;
        }
    }
    
    js_std_dbuf_init(ctx, &cmd_buf);
    dbuf_printf(&cmd_buf, "%s ''", URL_GET_PROGRAM);
    len = strlen(url);
    for(i = 0; i < len; i++) {
        c = url[i];
        if (c == '\'' || c == '\\')
            dbuf_putc(&cmd_buf, '\\');
        dbuf_putc(&cmd_buf, c);
    }
    JS_FreeCString(ctx, url);
    dbuf_putstr(&cmd_buf, "''");
    dbuf_putc(&cmd_buf, '\0');
    if (dbuf_error(&cmd_buf)) {
        dbuf_free(&cmd_buf);
        return JS_EXCEPTION;
    }
    //    printf("%s\n", (char *)cmd_buf.buf);
    f = popen((char *)cmd_buf.buf, "r");
    dbuf_free(&cmd_buf);
    if (!f) {
        return JS_ThrowTypeError(ctx, "could not start curl");
    }

    js_std_dbuf_init(ctx, data_buf);
    js_std_dbuf_init(ctx, header_buf);
    
    buf = js_malloc(ctx, URL_GET_BUF_SIZE);
    if (!buf)
        goto fail;

    /* get the HTTP status */
    if (http_get_header_line(f, buf, URL_GET_BUF_SIZE, NULL) < 0) {
        status = 0;
        goto bad_header;
    }
    status = http_get_status(buf);
    if (!full_flag && !(status >= 200 && status <= 299)) {
        goto bad_header;
    }
    
    /* wait until there is an empty line */
    for(;;) {
        if (http_get_header_line(f, buf, URL_GET_BUF_SIZE, header_buf) < 0) {
        bad_header:
            response = JS_NULL;
            goto done;
        }
        if (!strcmp(buf, "\r\n"))
            break;
    }
    if (dbuf_error(header_buf))
        goto fail;
    header_buf->size -= 2; /* remove the trailing CRLF */

    /* download the data */
    for(;;) {
        len = fread(buf, 1, URL_GET_BUF_SIZE, f);
        if (len == 0)
            break;
        dbuf_put(data_buf, (uint8_t *)buf, len);
    }
    if (dbuf_error(data_buf))
        goto fail;
    if (binary_flag) {
        response = JS_NewArrayBufferCopy(ctx,
                                         data_buf->buf, data_buf->size);
    } else {
        response = JS_NewStringLen(ctx, (char *)data_buf->buf, data_buf->size);
    }
    if (JS_IsException(response))
        goto fail;
 done:
    js_free(ctx, buf);
    buf = NULL;
    pclose(f);
    f = NULL;
    dbuf_free(data_buf);
    data_buf = NULL;

    if (full_flag) {
        ret_obj = JS_NewObject(ctx);
        if (JS_IsException(ret_obj))
            goto fail;
        JS_DefinePropertyValueStr(ctx, ret_obj, "response",
                                  response,
                                  JS_PROP_C_W_E);
        if (!JS_IsNull(response)) {
            JS_DefinePropertyValueStr(ctx, ret_obj, "responseHeaders",
                                      JS_NewStringLen(ctx, (char *)header_buf->buf,
                                                      header_buf->size),
                                      JS_PROP_C_W_E);
            JS_DefinePropertyValueStr(ctx, ret_obj, "status",
                                      JS_NewInt32(ctx, status),
                                      JS_PROP_C_W_E);
        }
    } else {
        ret_obj = response;
    }
    dbuf_free(header_buf);
    return ret_obj;
 fail:
    if (f)
        pclose(f);
    js_free(ctx, buf);
    if (data_buf)
        dbuf_free(data_buf);
    if (header_buf)
        dbuf_free(header_buf);
    JS_FreeValue(ctx, response);
    return JS_EXCEPTION;
}